

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint32 decomp_flags;
  size_t sVar2;
  mz_ulong mVar3;
  bool local_26e9;
  size_t local_26e8;
  size_t local_26e0;
  size_t local_26d8;
  size_t local_26d0;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint8 *pWrite_buf_cur;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_uint8 *local_5d0;
  void *pWrite_buf;
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 cur_file_ofs;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  tinfl_status local_130;
  mz_uint file_crc32;
  int status;
  mz_uint flags_local;
  void *pOpaque_local;
  mz_file_write_func pCallback_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  local_130 = TINFL_STATUS_DONE;
  read_buf_size._4_4_ = 0;
  read_buf_avail = 0;
  cur_file_ofs = 0;
  local_5d0 = (mz_uint8 *)0x0;
  inflator._8368_8_ = &pLocal_header;
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pCallback == (mz_file_write_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&pRead_buf);
    if (mVar1 == 0) {
      pZip_local._0_4_ = 0;
    }
    else if ((file_stat.m_local_header_ofs._4_4_ == 0) && (file_stat._24_8_ != 0)) {
      if ((file_stat.m_central_dir_ofs._4_2_ & 0x61) == 0) {
        if ((((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._6_2_ != 0)) &&
           (file_stat.m_central_dir_ofs._6_2_ != 8)) {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
          }
          pZip_local._0_4_ = 0;
        }
        else {
          file_stat.m_time._0_2_ = file_stat.m_internal_attr;
          file_stat.m_time._2_2_ = file_stat._50_2_;
          file_stat.m_time._4_4_ = file_stat.m_external_attr;
          sVar2 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat._48_8_,(void *)inflator._8368_8_,
                                   0x1e);
          if (sVar2 == 0x1e) {
            if (*(int *)inflator._8368_8_ == 0x4034b50) {
              file_stat.m_time =
                   (ulong)*(ushort *)(inflator._8368_8_ + 0x1a) + 0x1e +
                   (ulong)*(ushort *)(inflator._8368_8_ + 0x1c) + file_stat.m_time;
              if (pZip->m_archive_size < (ulong)(file_stat.m_time + file_stat._24_8_)) {
                if (pZip != (mz_zip_archive *)0x0) {
                  pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                pZip_local._0_4_ = 0;
              }
              else {
                if (pZip->m_pState->m_pMem == (void *)0x0) {
                  if ((ulong)file_stat._24_8_ < 0x10000) {
                    local_26d8 = file_stat._24_8_;
                  }
                  else {
                    local_26d8 = 0x10000;
                  }
                  read_buf_ofs = local_26d8;
                  pWrite_buf = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_26d8);
                  if (pWrite_buf == (void *)0x0) {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    return 0;
                  }
                  comp_remaining = 0;
                  out_buf_ofs = file_stat._24_8_;
                }
                else {
                  pWrite_buf = (void *)((long)pZip->m_pState->m_pMem + file_stat.m_time);
                  comp_remaining = file_stat._24_8_;
                  read_buf_ofs = file_stat._24_8_;
                  out_buf_ofs = 0;
                }
                if (((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._6_2_ != 0)) {
                  pWrite_buf_cur._0_4_ = 0;
                  local_5d0 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
                  if (local_5d0 == (mz_uint8 *)0x0) {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    local_130 = TINFL_STATUS_FAILED;
                  }
                  else {
                    do {
                      in_buf_size = (size_t)(local_5d0 + (cur_file_ofs & 0x7fff));
                      local_26d0 = 0x8000 - (cur_file_ofs & 0x7fff);
                      if ((comp_remaining == 0) && (pZip->m_pState->m_pMem == (void *)0x0)) {
                        if (read_buf_ofs < out_buf_ofs) {
                          local_26e8 = read_buf_ofs;
                        }
                        else {
                          local_26e8 = out_buf_ofs;
                        }
                        comp_remaining = local_26e8;
                        sVar2 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_time,pWrite_buf,
                                                 local_26e8);
                        if (sVar2 != local_26e8) {
                          if (pZip != (mz_zip_archive *)0x0) {
                            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                          }
                          local_130 = TINFL_STATUS_FAILED;
                          break;
                        }
                        file_stat.m_time = local_26e8 + file_stat.m_time;
                        out_buf_ofs = out_buf_ofs - local_26e8;
                        read_buf_avail = 0;
                      }
                      out_buf_size = comp_remaining;
                      decomp_flags = 0;
                      if (out_buf_ofs != 0) {
                        decomp_flags = 2;
                      }
                      local_130 = tinfl_decompress((tinfl_decompressor *)&pWrite_buf_cur,
                                                   (mz_uint8 *)((long)pWrite_buf + read_buf_avail),
                                                   &out_buf_size,local_5d0,(mz_uint8 *)in_buf_size,
                                                   &local_26d0,decomp_flags);
                      comp_remaining = comp_remaining - out_buf_size;
                      read_buf_avail = out_buf_size + read_buf_avail;
                      if (local_26d0 != 0) {
                        sVar2 = (*pCallback)(pOpaque,cur_file_ofs,(void *)in_buf_size,local_26d0);
                        if (sVar2 != local_26d0) {
                          if (pZip != (mz_zip_archive *)0x0) {
                            pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                          }
                          local_130 = TINFL_STATUS_FAILED;
                          break;
                        }
                        mVar3 = mz_crc32((ulong)read_buf_size._4_4_,(mz_uint8 *)in_buf_size,
                                         local_26d0);
                        read_buf_size._4_4_ = (uint)mVar3;
                        cur_file_ofs = local_26d0 + cur_file_ofs;
                        if (file_stat.m_comp_size < cur_file_ofs) {
                          if (pZip != (mz_zip_archive *)0x0) {
                            pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
                          }
                          local_130 = TINFL_STATUS_FAILED;
                          break;
                        }
                      }
                      local_26e9 = local_130 == TINFL_STATUS_NEEDS_MORE_INPUT ||
                                   local_130 == TINFL_STATUS_HAS_MORE_OUTPUT;
                    } while (local_26e9);
                  }
                }
                else if (pZip->m_pState->m_pMem == (void *)0x0) {
                  for (; out_buf_ofs != 0; out_buf_ofs = out_buf_ofs - local_26e0) {
                    if (read_buf_ofs < out_buf_ofs) {
                      local_26e0 = read_buf_ofs;
                    }
                    else {
                      local_26e0 = out_buf_ofs;
                    }
                    sVar2 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_time,pWrite_buf,
                                             local_26e0);
                    if (sVar2 != local_26e0) {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                      }
                      local_130 = TINFL_STATUS_FAILED;
                      break;
                    }
                    if ((flags & 0x400) == 0) {
                      mVar3 = mz_crc32((ulong)read_buf_size._4_4_,(mz_uint8 *)pWrite_buf,local_26e0)
                      ;
                      read_buf_size._4_4_ = (uint)mVar3;
                    }
                    sVar2 = (*pCallback)(pOpaque,cur_file_ofs,pWrite_buf,local_26e0);
                    if (sVar2 != local_26e0) {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                      }
                      local_130 = TINFL_STATUS_FAILED;
                      break;
                    }
                    file_stat.m_time = local_26e0 + file_stat.m_time;
                    cur_file_ofs = local_26e0 + cur_file_ofs;
                  }
                }
                else {
                  sVar2 = (*pCallback)(pOpaque,0,pWrite_buf,file_stat._24_8_);
                  if (sVar2 == file_stat._24_8_) {
                    if ((flags & 0x400) == 0) {
                      mVar3 = mz_crc32(0,(mz_uint8 *)pWrite_buf,file_stat._24_8_);
                      read_buf_size._4_4_ = (uint)mVar3;
                    }
                  }
                  else {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
                    }
                    local_130 = TINFL_STATUS_FAILED;
                  }
                  file_stat.m_time = file_stat._24_8_ + file_stat.m_time;
                  cur_file_ofs = file_stat._24_8_;
                }
                if ((local_130 == TINFL_STATUS_DONE) && ((flags & 0x400) == 0)) {
                  if (cur_file_ofs == file_stat.m_comp_size) {
                    if (read_buf_size._4_4_ != file_stat._16_4_) {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
                      }
                      local_130 = TINFL_STATUS_FAILED;
                    }
                  }
                  else {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
                    }
                    local_130 = TINFL_STATUS_FAILED;
                  }
                }
                if (pZip->m_pState->m_pMem == (void *)0x0) {
                  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pWrite_buf);
                }
                if (local_5d0 != (mz_uint8 *)0x0) {
                  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_5d0);
                }
                pZip_local._0_4_ = (uint)(local_130 == TINFL_STATUS_DONE);
              }
            }
            else {
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              }
              pZip_local._0_4_ = 0;
            }
          }
          else {
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            }
            pZip_local._0_4_ = 0;
          }
        }
      }
      else {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
        }
        pZip_local._0_4_ = 0;
      }
    }
    else {
      pZip_local._0_4_ = 1;
    }
  }
  return (uint)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip,
                                          mz_uint file_index,
                                          mz_file_write_func pCallback,
                                          void *pOpaque, mz_uint flags) {
  int status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
  mz_uint file_crc32 = MZ_CRC32_INIT;
#endif
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining,
                           out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL;
  void *pWrite_buf = NULL;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  /* A directory or zero length file */
  if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
    return MZ_TRUE;

  /* Encryption and patch files are not supported. */
  if (file_stat.m_bit_flag &
      (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

  /* This function only supports decompressing stored and deflate. */
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

  /* Read and do some minimal validation of the local directory entry (this
   * doesn't crack the zip64 stuff, which we already have from the central dir)
   */
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  cur_file_ofs += (mz_uint64)(MZ_ZIP_LOCAL_DIR_HEADER_SIZE) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* Decompress the file either directly from memory or from a file input
   * buffer. */
  if (pZip->m_pState->m_pMem) {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else {
    read_buf_size =
        MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    /* The file is stored or the caller has requested the compressed data. */
    if (pZip->m_pState->m_pMem) {
      if (((sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > MZ_UINT32_MAX))
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

      if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                    (size_t)file_stat.m_comp_size) != file_stat.m_comp_size) {
        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
        status = TINFL_STATUS_FAILED;
      } else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        file_crc32 =
            (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf,
                                (size_t)file_stat.m_comp_size);
#endif
      }

      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    } else {
      while (comp_remaining) {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                          (size_t)read_buf_avail) != read_buf_avail) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          status = TINFL_STATUS_FAILED;
          break;
        }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
          file_crc32 = (mz_uint32)mz_crc32(
              file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);
        }
#endif

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                      (size_t)read_buf_avail) != read_buf_avail) {
          mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
          status = TINFL_STATUS_FAILED;
          break;
        }

        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  } else {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                             TINFL_LZ_DICT_SIZE))) {
      mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      status = TINFL_STATUS_FAILED;
    } else {
      do {
        mz_uint8 *pWrite_buf_cur =
            (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size,
            out_buf_size =
                TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                            (size_t)read_buf_avail) != read_buf_avail) {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(
            &inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
            (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size,
            comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size) {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) !=
              out_buf_size) {
            mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
          file_crc32 =
              (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) ||
               (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) &&
      (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    /* Make sure the entire file was decompressed, and check its CRC. */
    if (out_buf_ofs != file_stat.m_uncomp_size) {
      mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
      status = TINFL_STATUS_FAILED;
    }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    else if (file_crc32 != file_stat.m_crc32) {
      mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
      status = TINFL_STATUS_FAILED;
    }
#endif
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}